

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<tonk::gateway::AsioHost::TickAndPostNextTimer()::__0,std::error_code>,tonk::gateway::AsioHost::TickAndPostNextTimer()::__0>
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:605:25),_std::error_code>
                *function,anon_class_8_1_8991fb9c *context)

{
  undefined8 in_RSI;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:605:25),_std::error_code>
  *in_RDI;
  
  asio::
  asio_handler_invoke<asio::detail::binder1<tonk::gateway::AsioHost::TickAndPostNextTimer()::__0,std::error_code>>
            (in_RDI,in_RSI);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}